

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O0

void __thiscall Fl_File_Chooser::update_preview(Fl_File_Chooser *this)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *n;
  Fl_Shared_Image *this_00;
  size_t sVar6;
  undefined4 extraout_var;
  Fl_Fontsize pix;
  char *pcVar7;
  bool bVar8;
  Fl_Fontsize local_f8;
  int size;
  uchar c;
  char *ptr;
  FILE *pFStack_e0;
  int bytes;
  FILE *fp;
  stat s;
  uint local_40;
  int set;
  int h;
  int w;
  int pbh;
  int pbw;
  Fl_Shared_Image *oldimage;
  Fl_Shared_Image *image;
  char *newlabel;
  char *filename;
  Fl_File_Chooser *this_local;
  
  image = (Fl_Shared_Image *)0x0;
  oldimage = (Fl_Shared_Image *)0x0;
  s.__glibc_reserved[2]._4_4_ = 0;
  cVar2 = Fl_Button::value((Fl_Button *)this->previewButton);
  if (cVar2 != '\0') {
    n = value(this,1);
    if (n == (char *)0x0) {
      s.__glibc_reserved[2]._4_4_ = 1;
    }
    else {
      iVar3 = fl_filename_isdir(n);
      if (iVar3 == 0) {
        iVar3 = fl_stat(n,(stat *)&fp);
        if (iVar3 == 0) {
          if (((uint)s.st_nlink & 0xf000) == 0x8000) {
            if (s.st_rdev == 0) {
              image = (Fl_Shared_Image *)anon_var_dwarf_d8cce;
              s.__glibc_reserved[2]._4_4_ = 1;
            }
            else {
              Fl_Window::cursor(&this->window->super_Fl_Window,FL_CURSOR_WAIT);
              Fl::check();
              oldimage = Fl_Shared_Image::get(n,0,0);
              if (oldimage != (Fl_Shared_Image *)0x0) {
                Fl_Window::cursor(&this->window->super_Fl_Window,FL_CURSOR_DEFAULT);
                Fl::check();
                s.__glibc_reserved[2]._4_4_ = 1;
              }
            }
          }
          else {
            image = (Fl_Shared_Image *)anon_var_dwarf_d8cb7;
            s.__glibc_reserved[2]._4_4_ = 1;
          }
        }
      }
      else {
        image = (Fl_Shared_Image *)anon_var_dwarf_308d1;
        s.__glibc_reserved[2]._4_4_ = 1;
      }
    }
    this_00 = (Fl_Shared_Image *)Fl_Widget::image(&this->previewBox->super_Fl_Widget);
    if (this_00 != (Fl_Shared_Image *)0x0) {
      Fl_Shared_Image::release(this_00);
    }
    Fl_Widget::image(&this->previewBox->super_Fl_Widget,(Fl_Image *)0x0);
    if (s.__glibc_reserved[2]._4_4_ == 0) {
      if (n == (char *)0x0) {
        pFStack_e0 = (FILE *)0x0;
      }
      else {
        pFStack_e0 = (FILE *)fl_fopen(n,"rb");
      }
      if (pFStack_e0 == (FILE *)0x0) {
        this->preview_text_[0] = '\0';
      }
      else {
        sVar6 = fread(this->preview_text_,1,0x7ff,pFStack_e0);
        this->preview_text_[(int)sVar6] = '\0';
        fclose(pFStack_e0);
      }
      Fl_Window::cursor(&this->window->super_Fl_Window,FL_CURSOR_DEFAULT);
      Fl::check();
      for (_size = this->preview_text_; pcVar7 = _size, *_size != 0; _size = _size + 1) {
        bVar1 = *_size;
        if ((bVar1 & 0x80) == 0) {
          iVar3 = isprint((uint)bVar1);
          if ((iVar3 == 0) && (iVar3 = isspace((uint)bVar1), iVar3 == 0)) break;
        }
        else if ((bVar1 & 0xe0) == 0xc0) {
          if ((_size[1] != 0) && (((int)_size[1] & 0xc0U) != 0x80)) break;
          _size = _size + 1;
        }
        else if ((bVar1 & 0xf0) == 0xe0) {
          if (((_size[1] != 0) && (((int)_size[1] & 0xc0U) != 0x80)) ||
             ((_size[2] != 0 && (pcVar7 = _size + 1, ((int)_size[2] & 0xc0U) != 0x80)))) break;
          _size = _size + 2;
        }
        else if ((bVar1 & 0xf8) == 0xf0) {
          if ((((_size[1] != 0) && (((int)_size[1] & 0xc0U) != 0x80)) ||
              ((_size[2] != 0 && (pcVar7 = _size + 1, ((int)_size[2] & 0xc0U) != 0x80)))) ||
             ((_size[3] != 0 && (pcVar7 = _size + 2, ((int)_size[3] & 0xc0U) != 0x80)))) break;
          _size = _size + 3;
        }
      }
      _size = pcVar7;
      if ((*_size != 0) || (_size == this->preview_text_)) {
        _size = this->preview_text_;
        while( true ) {
          bVar8 = false;
          if (*_size != 0) {
            iVar3 = isprint((uint)(byte)*_size);
            bVar8 = true;
            if (iVar3 == 0) {
              iVar3 = isspace((uint)(byte)*_size);
              bVar8 = iVar3 != 0;
            }
          }
          if (!bVar8) break;
          _size = _size + 1;
        }
      }
      if ((*_size == 0) && (_size != this->preview_text_)) {
        local_f8 = Fl_Widget::h(&this->previewBox->super_Fl_Widget);
        local_f8 = local_f8 / 0x14;
        if (local_f8 < 6) {
          local_f8 = 6;
        }
        else if (FL_NORMAL_SIZE < local_f8) {
          local_f8 = FL_NORMAL_SIZE;
        }
        Fl_Widget::label(&this->previewBox->super_Fl_Widget,this->preview_text_);
        Fl_Widget::align(&this->previewBox->super_Fl_Widget,0x55);
        Fl_Widget::labelsize(&this->previewBox->super_Fl_Widget,local_f8);
        Fl_Widget::labelfont(&this->previewBox->super_Fl_Widget,4);
      }
      else {
        pcVar7 = (char *)0x0;
        if (n != (char *)0x0) {
          pcVar7 = "?";
        }
        Fl_Widget::label(&this->previewBox->super_Fl_Widget,pcVar7);
        Fl_Widget::align(&this->previewBox->super_Fl_Widget,0x40);
        Fl_Widget::labelsize(&this->previewBox->super_Fl_Widget,0x4b);
        Fl_Widget::labelfont(&this->previewBox->super_Fl_Widget,0);
      }
    }
    else if ((oldimage == (Fl_Shared_Image *)0x0) ||
            ((((iVar3 = Fl_Image::w(&oldimage->super_Fl_Image), 0 < iVar3 &&
               (iVar3 = Fl_Image::h(&oldimage->super_Fl_Image), 0 < iVar3)) &&
              (iVar3 = Fl_Image::d(&oldimage->super_Fl_Image), -1 < iVar3)) &&
             (iVar3 = Fl_Image::count(&oldimage->super_Fl_Image), 0 < iVar3)))) {
      if (oldimage == (Fl_Shared_Image *)0x0) {
        if (image != (Fl_Shared_Image *)0x0) {
          Fl_Widget::label(&this->previewBox->super_Fl_Widget,(char *)image);
          Fl_Widget::align(&this->previewBox->super_Fl_Widget,0x40);
          pix = 0xc;
          if (*(char *)&(image->super_Fl_Image)._vptr_Fl_Image == '@') {
            pix = 0x4b;
          }
          Fl_Widget::labelsize(&this->previewBox->super_Fl_Widget,pix);
          Fl_Widget::labelfont(&this->previewBox->super_Fl_Widget,0);
        }
      }
      else {
        iVar3 = Fl_Widget::w(&this->previewBox->super_Fl_Widget);
        set = iVar3 + -0x14;
        iVar3 = Fl_Widget::h(&this->previewBox->super_Fl_Widget);
        uVar4 = iVar3 - 0x14;
        iVar3 = Fl_Image::w(&oldimage->super_Fl_Image);
        if ((set < iVar3) || (iVar3 = Fl_Image::h(&oldimage->super_Fl_Image), (int)uVar4 < iVar3)) {
          iVar3 = Fl_Image::h(&oldimage->super_Fl_Image);
          iVar5 = Fl_Image::w(&oldimage->super_Fl_Image);
          local_40 = (set * iVar3) / iVar5;
          if ((int)uVar4 < (int)local_40) {
            iVar3 = Fl_Image::w(&oldimage->super_Fl_Image);
            iVar5 = Fl_Image::h(&oldimage->super_Fl_Image);
            set = (int)(uVar4 * iVar3) / iVar5;
            local_40 = uVar4;
          }
          iVar3 = (*(oldimage->super_Fl_Image)._vptr_Fl_Image[2])
                            (oldimage,(ulong)(uint)set,(ulong)local_40);
          Fl_Widget::image(&this->previewBox->super_Fl_Widget,
                           (Fl_Image *)CONCAT44(extraout_var,iVar3));
          Fl_Shared_Image::release(oldimage);
        }
        else {
          Fl_Widget::image(&this->previewBox->super_Fl_Widget,&oldimage->super_Fl_Image);
        }
        Fl_Widget::align(&this->previewBox->super_Fl_Widget,0x40);
        Fl_Widget::label(&this->previewBox->super_Fl_Widget,(char *)0x0);
      }
    }
    else {
      Fl_Widget::label(&this->previewBox->super_Fl_Widget,"X");
      Fl_Widget::align(&this->previewBox->super_Fl_Widget,0x40);
      Fl_Widget::labelsize(&this->previewBox->super_Fl_Widget,0x46);
      Fl_Widget::labelfont(&this->previewBox->super_Fl_Widget,0);
      Fl_Widget::redraw(&this->previewBox->super_Fl_Widget);
    }
    Fl_Widget::redraw(&this->previewBox->super_Fl_Widget);
  }
  return;
}

Assistant:

void
Fl_File_Chooser::update_preview()
{
  const char		*filename;	// Current filename
  const char            *newlabel = 0;  // New label text
  Fl_Shared_Image	*image = 0,     // New image
			*oldimage;	// Old image
  int			pbw, pbh;	// Width and height of preview box
  int			w, h;		// Width and height of preview image
  int                   set = 0;        // Set this flag as soon as a decent preview is found

  if (!previewButton->value()) return;

  filename = value();
  if (filename == NULL) {
    // no file name at all, so we have an empty preview
    set = 1;
  } else if (fl_filename_isdir(filename)) {
    // filename is a directory, show a folder icon
    newlabel = "@fileopen";
    set = 1;
  } else {
    struct stat s;
    if (fl_stat(filename, &s)==0) {
      if ((s.st_mode&S_IFMT)!=S_IFREG) {
        // this is no regular file, probably some kind of device
        newlabel = "@-3refresh"; // a cross
        set = 1;
      } else if (s.st_size==0) {
        // this file is emty
        newlabel = "<empty file>";
        set = 1;
      } else {
        // if this file is an image, try to load it
        window->cursor(FL_CURSOR_WAIT);
        Fl::check();
        
        image = Fl_Shared_Image::get(filename);
        
        if (image) {
          window->cursor(FL_CURSOR_DEFAULT);
          Fl::check();
          set = 1;
        }
      }
    }
  }

  oldimage = (Fl_Shared_Image *)previewBox->image();

  if (oldimage) oldimage->release();

  previewBox->image(0);

  if (!set) {
    FILE	*fp;
    int		bytes;
    char	*ptr;

    if (filename) fp = fl_fopen(filename, "rb");
    else fp = NULL;

    if (fp != NULL) {
      // Try reading the first 1k of data for a label...
      bytes = (int) fread(preview_text_, 1, sizeof(preview_text_) - 1, fp);
      preview_text_[bytes] = '\0';
      fclose(fp);
    } else {
      // Assume we can't read any data...
      preview_text_[0] = '\0';
    }

    window->cursor(FL_CURSOR_DEFAULT);
    Fl::check();

    // Scan the buffer for printable UTF8 chars...
    for (ptr = preview_text_; *ptr; ptr++) {
      uchar c = uchar(*ptr);
      if ( (c&0x80)==0 ) {
        if (!isprint(c&255) && !isspace(c&255)) break;
      } else if ( (c&0xe0)==0xc0 ) {
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
      } else if ( (c&0xf0)==0xe0 ) {
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
      } else if ( (c&0xf8)==0xf0 ) {
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
      }
    } 
//         *ptr && (isprint(*ptr & 255) || isspace(*ptr & 255));
//	 ptr ++);

    // Scan the buffer for printable characters in 8 bit
    if (*ptr || ptr == preview_text_) {
      for (ptr = preview_text_;
         *ptr && (isprint(*ptr & 255) || isspace(*ptr & 255));
	 ptr ++) {/*empty*/}
    }

    if (*ptr || ptr == preview_text_) {
      // Non-printable file, just show a big ?...
      previewBox->label(filename ? "?" : 0);
      previewBox->align(FL_ALIGN_CLIP);
      previewBox->labelsize(75);
      previewBox->labelfont(FL_HELVETICA);
    } else {
      // Show the first 1k of text...
      int size = previewBox->h() / 20;
      if (size < 6) size = 6;
      else if (size > FL_NORMAL_SIZE) size = FL_NORMAL_SIZE;

      previewBox->label(preview_text_);
      previewBox->align((Fl_Align)(FL_ALIGN_CLIP | FL_ALIGN_INSIDE |
                                   FL_ALIGN_LEFT | FL_ALIGN_TOP));
      previewBox->labelsize(size);
      previewBox->labelfont(FL_COURIER);
    }
  } else if (image && ( (image->w() <= 0) ||
                        (image->h() <= 0) ||
                        (image->d() < 0)  ||
                        (image->count() <= 0))) {
    // Image has errors? Show big 'X'
    previewBox->label("X");
    previewBox->align(FL_ALIGN_CLIP);
    previewBox->labelsize(70);
    previewBox->labelfont(FL_HELVETICA);
    previewBox->redraw();
  } else if (image) {
    pbw = previewBox->w() - 20;
    pbh = previewBox->h() - 20;

    if (image->w() > pbw || image->h() > pbh) {
      w   = pbw;
      h   = w * image->h() / image->w();

      if (h > pbh) {
	h = pbh;
	w = h * image->w() / image->h();
      }

      oldimage = (Fl_Shared_Image *)image->copy(w, h);
      previewBox->image((Fl_Image *)oldimage);

      image->release();
    } else {
      previewBox->image((Fl_Image *)image);
    }

    previewBox->align(FL_ALIGN_CLIP);
    previewBox->label(0);
  } else if (newlabel) {
    previewBox->label(newlabel);
    previewBox->align(FL_ALIGN_CLIP);
    previewBox->labelsize(newlabel[0]=='@'?75:12);
    previewBox->labelfont(FL_HELVETICA);
  }

  previewBox->redraw();
}